

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

int64 __thiscall Time::toTimestamp(Time *this)

{
  long lVar1;
  undefined1 local_50 [8];
  tm tm;
  Time *this_local;
  
  local_50._0_4_ = this->sec;
  local_50._4_4_ = this->min;
  tm.tm_sec = this->hour;
  tm.tm_min = this->day;
  tm.tm_hour = this->month + -1;
  tm.tm_mday = this->year + -0x76c;
  tm.tm_mon = this->wday;
  tm.tm_year = this->yday;
  tm.tm_wday = (int)(this->dst & 1);
  tm.tm_zone = (char *)this;
  if ((this->utc & 1U) == 0) {
    lVar1 = mktime((tm *)local_50);
  }
  else {
    lVar1 = timegm((tm *)local_50);
  }
  this_local = (Time *)(lVar1 * 1000);
  return (int64)this_local;
}

Assistant:

int64 Time::toTimestamp()
{
  tm tm;
  tm.tm_sec = sec;
  tm.tm_min = min;
  tm.tm_hour = hour;
  tm.tm_mday = day;
  tm.tm_mon = month - 1;
  tm.tm_year = year - 1900;
  tm.tm_wday = wday;
  tm.tm_yday = yday;
  tm.tm_isdst = dst;
  if(utc)
#ifdef _MSC_VER
    return _mkgmtime(&tm) * 1000LL;
#else
    return timegm(&tm) * 1000LL;
#endif
  else
    return mktime(&tm) * 1000LL;
}